

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  long lVar1;
  byte type2_00;
  int iVar2;
  container_t *c;
  shared_container_t *psVar3;
  shared_container_t *psVar4;
  uint8_t uVar5;
  bitset_container_t *src_2;
  ulong uVar6;
  uint uVar7;
  uint start_index;
  byte type1;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint16_t key;
  uint16_t uVar11;
  bool bVar12;
  uint8_t type2;
  uint8_t result_type;
  byte local_66;
  uint8_t local_65;
  uint local_64;
  shared_container_t *local_60;
  uint local_54;
  shared_container_t *local_50;
  ulong local_48;
  ulong local_40;
  bitset_container_t *local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x43cb,
                  "void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  local_65 = '\0';
  local_64 = (x2->high_low_container).size;
  if (local_64 == 0) {
    return;
  }
  uVar7 = (x1->high_low_container).size;
  uVar6 = (ulong)uVar7;
  if (uVar7 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar11 = *(x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  uVar10 = 0;
  uVar8 = 0;
LAB_001162e2:
  do {
    start_index = (uint)uVar8;
    uVar10 = (ulong)(int)uVar10;
    uVar7 = (int)uVar6 - 1;
    while( true ) {
      uVar9 = (uint)uVar10;
      if (uVar11 == key) break;
      if (key <= uVar11) {
        local_66 = (x2->high_low_container).typecodes[uVar8 & 0xffff];
        local_48 = uVar6;
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar8 & 0xffff],&local_66,
                       (_Bool)((x2->high_low_container).flags & 1));
        if (((x2->high_low_container).flags & 1) != 0) {
          if ((x2->high_low_container).size <= (int)start_index) goto LAB_00116619;
          (x2->high_low_container).containers[(int)start_index] = c;
          (x2->high_low_container).typecodes[(int)start_index] = local_66;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar9,key,c,local_66);
        start_index = start_index + 1;
        uVar8 = (ulong)start_index;
        if (start_index != local_64) {
          key = (x2->high_low_container).keys[uVar8 & 0xffff];
        }
        uVar6 = (ulong)((int)local_48 + 1);
        if (start_index == local_64) {
LAB_001165ac:
          uVar9 = uVar9 + 1;
          goto LAB_001165af;
        }
        uVar10 = uVar10 + 1;
        goto LAB_001162e2;
      }
      if (uVar7 == uVar9) goto LAB_001165ac;
      uVar10 = uVar10 + 1;
      uVar11 = (x1->high_low_container).keys[uVar10 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar10 & 0xffff];
    psVar3 = (shared_container_t *)(x1->high_low_container).containers[uVar10 & 0xffff];
    local_66 = (x2->high_low_container).typecodes[uVar8 & 0xffff];
    src_2 = (bitset_container_t *)(x2->high_low_container).containers[uVar8 & 0xffff];
    local_54 = start_index;
    if (type1 == 4) {
      local_60 = psVar3;
      local_48 = uVar6;
      local_50 = (shared_container_t *)container_lazy_xor(psVar3,'\x04',src_2,local_66,&local_65);
      shared_container_free(local_60);
      psVar3 = local_50;
    }
    else {
      type2_00 = local_66;
      if (local_66 == 4) {
        type2_00 = *(byte *)&src_2->words;
        local_48 = uVar6;
        if (type2_00 == 4) goto LAB_00116638;
        src_2 = *(bitset_container_t **)src_2;
      }
      if ((uint)type2_00 + (uint)type1 * 4 == 5) {
        local_60 = psVar3;
        local_48 = uVar6;
        bitset_container_xor_nocard((bitset_container_t *)psVar3,src_2,(bitset_container_t *)psVar3)
        ;
        local_65 = '\x01';
        psVar3 = local_60;
      }
      else {
        local_48 = uVar6;
        if ((type1 == 1) && (*(int *)&psVar3->container == -1)) {
          local_60 = psVar3;
          local_50 = (shared_container_t *)(ulong)type1;
          local_40 = (ulong)type2_00;
          local_38 = src_2;
          iVar2 = bitset_container_compute_cardinality((bitset_container_t *)psVar3);
          type2_00 = (byte)local_40;
          type1 = (byte)local_50;
          *(int *)&local_60->container = iVar2;
          src_2 = local_38;
          psVar3 = local_60;
        }
        psVar3 = (shared_container_t *)container_ixor(psVar3,type1,src_2,type2_00,&local_65);
      }
    }
    psVar4 = psVar3;
    uVar5 = local_65;
    if (local_65 == '\x04') {
      uVar5 = psVar3->typecode;
      if (uVar5 == '\x04') {
LAB_00116638:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      psVar4 = (shared_container_t *)psVar3->container;
    }
    if ((uVar5 == '\x03') || (uVar5 == '\x02')) {
      bVar12 = 0 < *(int *)&psVar4->container;
    }
    else {
      if (uVar5 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (*(int *)&psVar4->container == -1) {
        if (**(uint64_t **)&psVar4->typecode == 0) {
          uVar6 = 0xffffffffffffffff;
          do {
            if (uVar6 == 0x3fe) {
              uVar8 = 0x3ff;
              break;
            }
            uVar8 = uVar6 + 1;
            lVar1 = uVar6 + 2;
            uVar6 = uVar8;
          } while ((*(uint64_t **)&psVar4->typecode)[lVar1] == 0);
          bVar12 = 0x3fe < uVar8;
        }
        else {
          bVar12 = false;
        }
      }
      else {
        bVar12 = *(int *)&psVar4->container == 0;
      }
      bVar12 = (bool)(bVar12 ^ 1);
    }
    if (bVar12) {
      if ((x1->high_low_container).size <= (int)uVar9) {
LAB_00116619:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (x1->high_low_container).containers[uVar10] = psVar3;
      (x1->high_low_container).typecodes[uVar10] = local_65;
      uVar10 = (ulong)(uVar9 + 1);
      uVar6 = local_48;
    }
    else {
      container_free(psVar3,local_65);
      ra_remove_at_index(&x1->high_low_container,uVar9);
      uVar6 = (ulong)uVar7;
    }
    start_index = local_54 + 1;
    uVar8 = (ulong)start_index;
    uVar9 = (uint)uVar10;
    if (start_index == local_64 || uVar9 == (uint)uVar6) {
LAB_001165af:
      if (uVar9 != (uint)uVar6) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,start_index,local_64,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    uVar11 = (x1->high_low_container).keys[uVar9 & 0xffff];
    key = (x2->high_low_container).keys[start_index & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}